

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O3

void fill_unknown_vector(double *G,double *V,double *unknown_vector,uint space_nodes)

{
  ulong uVar1;
  
  if (space_nodes != 0) {
    uVar1 = 0;
    do {
      unknown_vector[uVar1 & 0xffffffff] = *(double *)((long)G + uVar1 * 4);
      unknown_vector[(int)uVar1 + 1] = *(double *)((long)V + uVar1 * 4);
      uVar1 = uVar1 + 2;
    } while ((ulong)space_nodes * 2 != uVar1);
  }
  return;
}

Assistant:

void fill_unknown_vector (
    double * G,
    double * V,
    double * unknown_vector,
    unsigned space_nodes) {

  register unsigned space_step = 0;
  for (space_step = 0; space_step < space_nodes; ++space_step) {
    unknown_vector[G_INDEX(space_step)] = G[space_step];
    unknown_vector[V_INDEX(space_step)] = V[space_step];
  }
  return;
}